

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O2

int __thiscall BufferedReaderManager::init(BufferedReaderManager *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint in_ECX;
  uint32_t in_EDX;
  uint32_t uVar2;
  
  uVar1 = 0x200000;
  if ((uint)ctx != 0) {
    uVar1 = (uint)ctx;
  }
  this->m_blockSize = uVar1;
  uVar2 = uVar1 + 0x8000;
  if (in_EDX != 0) {
    uVar2 = in_EDX;
  }
  this->m_allocSize = uVar2;
  uVar1 = uVar1 >> 1;
  if (in_ECX != 0) {
    uVar1 = in_ECX;
  }
  this->m_prereadThreshold = uVar1;
  return uVar1;
}

Assistant:

void BufferedReaderManager::init(const uint32_t blockSize, const uint32_t allocSize, const uint32_t prereadThreshold)
{
    m_blockSize = blockSize > 0 ? blockSize : DEFAULT_FILE_BLOCK_SIZE;
    m_allocSize = allocSize > 0 ? allocSize : m_blockSize + MAX_AV_PACKET_SIZE;
    m_prereadThreshold = prereadThreshold > 0 ? prereadThreshold : m_blockSize / 2;
}